

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall QZipStreamStrategy::QZipStreamStrategy(QZipStreamStrategy *this,QIODevice *device)

{
  QBuffer *this_00;
  QBuffer *this_01;
  QZipWriter *this_02;
  QXmlStreamWriter *this_03;
  ulong uVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  storage_type *psVar5;
  size_t in_R9;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QByteArrayView QVar11;
  QAnyStringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QAnyStringView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QArrayDataPointer<char16_t> local_a0;
  char16_t *local_88;
  ulong uStack_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QOutputStrategy).contentStream = (QIODevice *)0x0;
  (this->super_QOutputStrategy).counter = 1;
  (this->super_QOutputStrategy)._vptr_QOutputStrategy =
       (_func_int **)&PTR__QZipStreamStrategy_0078a578;
  this_00 = &this->content;
  QBuffer::QBuffer(this_00,(QObject *)0x0);
  this_01 = &this->manifest;
  QBuffer::QBuffer(this_01,(QObject *)0x0);
  this_02 = &this->zip;
  QZipWriter::QZipWriter(this_02,device);
  this_03 = &this->manifestWriter;
  QXmlStreamWriter::QXmlStreamWriter(this_03,(QIODevice *)this_01);
  (this->manifestNS).d.d = (Data *)0x0;
  (this->manifestNS).d.ptr = (char16_t *)0x0;
  (this->manifestNS).d.size = 0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_58,"application/vnd.oasis.opendocument.text",-1);
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_02);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("mimetype",9);
  QVar7.m_data = psVar5;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar7);
  QZipWriter::addFile((QString *)this_02,(QByteArray *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QZipWriter::setCompressionPolicy((CompressionPolicy)this_02);
  (this->super_QOutputStrategy).contentStream = (QIODevice *)this_00;
  QBuffer::open(this_00,2);
  QBuffer::open(this_01,2);
  psVar5 = (storage_type *)
           QByteArrayView::lengthHelperCharArray
                     ("urn:oasis:names:tc:opendocument:xmlns:manifest:1.0",0x33);
  QVar8.m_data = psVar5;
  QVar8.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar8);
  pDVar3 = (this->manifestNS).d.d;
  pcVar2 = (this->manifestNS).d.ptr;
  (this->manifestNS).d.d = local_78.d;
  (this->manifestNS).d.ptr = local_78.ptr;
  uVar1 = (this->manifestNS).d.size;
  (this->manifestNS).d.size = local_78.size;
  local_78.d = pDVar3;
  local_78.ptr = pcVar2;
  local_78.size = uVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QXmlStreamWriter::setAutoFormatting(SUB81(this_03,0));
  QXmlStreamWriter::setAutoFormattingIndent((int)this_03);
  pcVar2 = (this->manifestNS).d.ptr;
  uVar1 = (this->manifestNS).d.size;
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("manifest",9);
  QVar9.m_data = psVar5;
  QVar9.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar9);
  QVar10.m_size = (size_t)pcVar2;
  QVar10.field_0.m_data_utf8 = (char *)this_03;
  QVar20.m_size = (size_t)local_78.ptr;
  QVar20.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QXmlStreamWriter::writeNamespace(QVar10,QVar20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QXmlStreamWriter::writeStartDocument();
  pcVar2 = (this->manifestNS).d.ptr;
  uVar1 = (this->manifestNS).d.size;
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("manifest",9);
  QVar11.m_data = psVar5;
  QVar11.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar11);
  QVar12.m_size = (size_t)pcVar2;
  QVar12.field_0.m_data_utf8 = (char *)this_03;
  QVar21.m_size = (size_t)local_78.ptr;
  QVar21.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar12,QVar21);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  pcVar2 = (this->manifestNS).d.ptr;
  uVar1 = (this->manifestNS).d.size;
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("version",8);
  QVar13.m_data = psVar5;
  QVar13.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar13);
  pcVar4 = local_78.ptr;
  aVar6.m_data = (void *)(local_78.size | 0x8000000000000000);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("1.2",4);
  QVar14.m_data = psVar5;
  QVar14.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar14);
  local_88 = local_a0.ptr;
  uStack_80 = local_a0.size | 0x8000000000000000;
  QVar15.m_size = (size_t)pcVar2;
  QVar15.field_0.m_data_utf8 = (char *)this_03;
  QVar22.m_size = (size_t)pcVar4;
  QVar22.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar23.m_size = in_R9;
  QVar23.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeAttribute(QVar15,QVar22,QVar23);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("/",2);
  QVar16.m_data = psVar5;
  QVar16.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar16);
  psVar5 = (storage_type *)
           QByteArrayView::lengthHelperCharArray("application/vnd.oasis.opendocument.text",0x28);
  QVar17.m_data = psVar5;
  QVar17.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar17);
  addFile(this,(QString *)&local_78,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("content.xml",0xc);
  QVar18.m_data = psVar5;
  QVar18.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar18);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("text/xml",9);
  QVar19.m_data = psVar5;
  QVar19.m_size = (qsizetype)&local_a0;
  QString::fromLatin1(QVar19);
  addFile(this,(QString *)&local_78,(QString *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QZipStreamStrategy(QIODevice *device)
        : zip(device),
        manifestWriter(&manifest)
    {
        QByteArray mime("application/vnd.oasis.opendocument.text");
        zip.setCompressionPolicy(QZipWriter::NeverCompress);
        zip.addFile(QString::fromLatin1("mimetype"), mime); // for mime-magick
        zip.setCompressionPolicy(QZipWriter::AutoCompress);
        contentStream = &content;
        content.open(QIODevice::WriteOnly);
        manifest.open(QIODevice::WriteOnly);

        manifestNS = QString::fromLatin1("urn:oasis:names:tc:opendocument:xmlns:manifest:1.0");
        // prettyfy
        manifestWriter.setAutoFormatting(true);
        manifestWriter.setAutoFormattingIndent(1);

        manifestWriter.writeNamespace(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeStartDocument();
        manifestWriter.writeStartElement(manifestNS, QString::fromLatin1("manifest"));
        manifestWriter.writeAttribute(manifestNS, QString::fromLatin1("version"), QString::fromLatin1("1.2"));
        addFile(QString::fromLatin1("/"), QString::fromLatin1("application/vnd.oasis.opendocument.text"));
        addFile(QString::fromLatin1("content.xml"), QString::fromLatin1("text/xml"));
    }